

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

void Eigen::internal::
     conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
     ::run(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_this,Index rows,Index cols)

{
  double *__ptr;
  undefined1 auVar1 [16];
  Index IVar2;
  Index IVar3;
  undefined8 *puVar4;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1> local_90;
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  long local_60;
  MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1> local_58;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  
  if (*(long *)(_this + 8) == rows) {
    if (*(long *)(_this + 0x10) == cols) {
      return;
    }
    if ((cols != 0 && rows != 0) &&
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar1 / SEXT816(cols),0) < rows)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8,rows,SUB168(auVar1 % SEXT816(cols),0));
      *puVar4 = std::ios::widen;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::conservativeResize
              ((DenseStorage<double,__1,__1,__1,_0> *)_this,cols * rows,rows,cols);
    return;
  }
  local_a8.m_data = (double *)0x0;
  local_a8.m_rows = 0;
  local_a8.m_cols = 0;
  if ((cols | rows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((cols != 0 && rows != 0) &&
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar1 / SEXT816(cols),0) < rows)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8,rows,SUB168(auVar1 % SEXT816(cols),0));
    *puVar4 = std::ios::widen;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_a8,cols * rows,rows,cols);
  local_28 = *(ulong *)(_this + 8);
  local_58.super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
  m_rows.m_value = rows;
  if ((long)local_28 < rows) {
    local_58.super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
    .m_rows.m_value = local_28;
  }
  local_58.super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
  m_cols.m_value = cols;
  if ((long)*(ulong *)(_this + 0x10) < cols) {
    local_58.super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
    .m_cols.m_value = *(ulong *)(_this + 0x10);
  }
  local_58.super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
  m_data = *(PointerType *)_this;
  if (-1 < (local_58.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_cols.m_value |
           local_58.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_rows.m_value) ||
      local_58.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
      == (PointerType)0x0) {
    local_38 = 0;
    uStack_30 = 0;
    local_40 = _this;
    if (-1 < (local_58.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value |
             local_58.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_rows.m_value)) {
      local_90.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = local_a8.m_data;
      local_70 = 0;
      uStack_68 = 0;
      local_60 = local_a8.m_rows;
      local_90.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows
      .m_value = local_58.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_rows.m_value;
      local_90.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols
      .m_value = local_58.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_cols.m_value;
      local_78 = (undefined1 *)&local_a8;
      if ((local_58.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_rows.m_value <= local_a8.m_rows) &&
         (local_78 = (undefined1 *)&local_a8,
         local_58.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_cols.m_value <= local_a8.m_cols)) {
        local_78 = (undefined1 *)&local_a8;
        MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>::operator=
                  (&local_90,&local_58);
        __ptr = *(double **)_this;
        *(double **)_this = local_a8.m_data;
        IVar2 = *(Index *)(_this + 8);
        IVar3 = *(Index *)(_this + 0x10);
        *(Index *)(_this + 8) = local_a8.m_rows;
        *(Index *)(_this + 0x10) = local_a8.m_cols;
        local_a8.m_data = __ptr;
        local_a8.m_rows = IVar2;
        local_a8.m_cols = IVar3;
        free(__ptr);
        return;
      }
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                  ,0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,
                "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
               );
}

Assistant:

static void run(DenseBase<Derived>& _this, Index rows, Index cols)
  {
    if (_this.rows() == rows && _this.cols() == cols) return;
    EIGEN_STATIC_ASSERT_DYNAMIC_SIZE(Derived)

    if ( IsRelocatable
          && (( Derived::IsRowMajor && _this.cols() == cols) ||  // row-major and we change only the number of rows
              (!Derived::IsRowMajor && _this.rows() == rows) ))  // column-major and we change only the number of columns
    {
      internal::check_rows_cols_for_overflow<Derived::MaxSizeAtCompileTime>::run(rows, cols);
      _this.derived().m_storage.conservativeResize(rows*cols,rows,cols);
    }
    else
    {
      // The storage order does not allow us to use reallocation.
      Derived tmp(rows,cols);
      const Index common_rows = numext::mini(rows, _this.rows());
      const Index common_cols = numext::mini(cols, _this.cols());
      tmp.block(0,0,common_rows,common_cols) = _this.block(0,0,common_rows,common_cols);
      _this.derived().swap(tmp);
    }
  }